

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O2

void cmime_message_set_message_id(CMimeMessage_T *message,char *mid)

{
  char *value;
  size_t sVar1;
  ulong uVar2;
  
  if (*mid == '<') {
    value = strdup(mid);
  }
  else {
    sVar1 = strlen(mid);
    value = (char *)malloc(sVar1 + 4);
    *value = '<';
    for (uVar2 = 1; uVar2 - sVar1 != 1; uVar2 = uVar2 + 1) {
      value[uVar2] = mid[uVar2 - 1];
    }
    (value + (uVar2 & 0xffffffff))[0] = '>';
    (value + (uVar2 & 0xffffffff))[1] = '\0';
  }
  _cmime_internal_set_linked_header_value(message->headers,"Message-ID",value);
  free(value);
  return;
}

Assistant:

void cmime_message_set_message_id(CMimeMessage_T *message, const char *mid) {
    char *id = NULL;
    int i;
    int pos = 0;
    if (mid[0] != '<') {
        id = (char *)malloc(strlen(mid) + 4);
        id[pos++] = '<';
        for (i = 0; i < strlen(mid); i++) {
            id[pos++] = mid[i];
        }
        id[pos++] = '>';
        id[pos++] = '\0';
    } else
        id = strdup(mid);

    _cmime_internal_set_linked_header_value(message->headers,"Message-ID",id);
    free(id);
}